

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::NewCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Output OStack_28;
  char *params_local;
  char *pcVar3;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_28,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::New_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," [");
    std::operator<<((ostream *)&std::cout,(string *)token::StartPos_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"|");
    std::operator<<((ostream *)&std::cout,(string *)token::Fen_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," <fen_string>] [");
    std::operator<<((ostream *)&std::cout,(string *)token::Moves_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," <movelist>]");
    Output::~Output(&OStack_28);
    Output::Output(&OStack_28,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Clear search data, set position, and apply <movelist>.");
    Output::~Output(&OStack_28);
    Output::Output(&OStack_28,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"If no position is specified ");
    std::operator<<((ostream *)&std::cout,(string *)token::StartPos_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," is assumed.");
    Output::~Output(&OStack_28);
    return;
  }
  UCINewGameCommand(this,"");
  if ((((params_local == (char *)0x0) || (*params_local == '\0')) ||
      (bVar1 = ParamMatch((string *)token::StartPos_abi_cxx11_,&params_local), bVar1)) ||
     (bVar1 = ParamMatch((string *)token::Moves_abi_cxx11_,&params_local), bVar1)) {
    iVar2 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  }
  else {
    ParamMatch((string *)token::Fen_abi_cxx11_,&params_local);
    iVar2 = (*this->engine->_vptr_ChessEngine[9])(this->engine,params_local);
    pcVar3 = (char *)CONCAT44(extraout_var_01,iVar2);
    params_local = pcVar3;
  }
  if (pcVar3 != (char *)0x0) {
    ParamMatch((string *)token::Moves_abi_cxx11_,&params_local);
    if (params_local != (char *)0x0) {
      do {
        pcVar4 = NextWord(&params_local);
        pcVar3 = params_local;
        if ((*pcVar4 == '\0') || (bVar1 = IsMove(params_local), !bVar1)) goto LAB_0012d11c;
        iVar2 = (*this->engine->_vptr_ChessEngine[10])(this->engine,pcVar3);
        params_local = (char *)CONCAT44(extraout_var_00,iVar2);
      } while (params_local != (char *)0x0);
      Output::Output(&OStack_28,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"Invalid move: ");
      std::operator<<((ostream *)&std::cout,pcVar3);
      Output::~Output(&OStack_28);
    }
LAB_0012d11c:
    if (ChessEngine::_debug == '\x01') {
      (*this->engine->_vptr_ChessEngine[0xc])();
    }
  }
  return;
}

Assistant:

void UCIAdapter::NewCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::New << " [" << token::StartPos << "|"
             << token::Fen << " <fen_string>] [" << token::Moves
             << " <movelist>]";
    Output() << "Clear search data, set position, and apply <movelist>.";
    Output() << "If no position is specified " << token::StartPos
             << " is assumed.";
    return;
  }

  UCINewGameCommand("");

  if (!params || !*params ||
      ParamMatch(token::StartPos, params) ||
      ParamMatch(token::Moves, params))
  {
    if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
      return;
    }
  }
  else {
    ParamMatch(token::Fen, params); // simply consume "fen" token if it present
    if (!(params = engine->SetPosition(params))) {
      return;
    }
  }

  // simply consume "moves" token if present
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}